

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O2

ValidateXrHandleResult __thiscall
HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo>::verifyHandle
          (HandleInfoBase<XrAction_T_*,_GenValidUsageXrHandleInfo> *this,
          XrAction_T **handle_to_check)

{
  iterator iVar1;
  ValidateXrHandleResult VVar2;
  UniqueLock lock;
  
  VVar2 = VALIDATE_XR_HANDLE_INVALID;
  if (handle_to_check != (XrAction_T **)0x0) {
    if (*handle_to_check == (XrAction_T *)0x0) {
      VVar2 = VALIDATE_XR_HANDLE_NULL;
    }
    else {
      std::unique_lock<std::mutex>::unique_lock(&lock,&this->dispatch_mutex_);
      iVar1 = std::
              _Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<XrAction_T_*,_std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_std::allocator<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrAction_T_*>,_std::hash<XrAction_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,handle_to_check);
      VVar2 = VALIDATE_XR_HANDLE_SUCCESS -
              (iVar1.
               super__Node_iterator_base<std::pair<XrAction_T_*const,_std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>_>,_false>
               ._M_cur == (__node_type *)0x0);
      std::unique_lock<std::mutex>::~unique_lock(&lock);
    }
  }
  return VVar2;
}

Assistant:

inline ValidateXrHandleResult HandleInfoBase<HandleType, InfoType>::verifyHandle(HandleType const *handle_to_check) {
    try {
        if (nullptr == handle_to_check) {
            return VALIDATE_XR_HANDLE_INVALID;
        }
        // XR_NULL_HANDLE is valid in some cases, so we want to return that we found that value
        // and let the calling function decide what to do with it.
        if (*handle_to_check == XR_NULL_HANDLE) {
            return VALIDATE_XR_HANDLE_NULL;
        }

        // Try to find the handle in the appropriate map
        UniqueLock lock(dispatch_mutex_);
        auto entry_returned = info_map_.find(*handle_to_check);
        // If it is not a valid handle, it should return the end of the map.
        if (info_map_.end() == entry_returned) {
            return VALIDATE_XR_HANDLE_INVALID;
        }
        return VALIDATE_XR_HANDLE_SUCCESS;
    } catch (...) {
        return VALIDATE_XR_HANDLE_INVALID;
    }
}